

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O0

bool ZXing::OneD::IsCharacterPair(PatternView v,int modsLeft,int modsRight)

{
  bool bVar1;
  float modSizeRef;
  float in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  PatternView *view;
  bool local_51;
  PatternView *in_stack_ffffffffffffffb0;
  
  view = (PatternView *)&stack0x00000008;
  DataBar::ModSizeFinder(in_stack_ffffffffffffffb0);
  DataBar::LeftChar(view);
  bVar1 = DataBar::IsCharacter(view,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  local_51 = false;
  if (bVar1) {
    DataBar::RightChar(view);
    local_51 = DataBar::IsCharacter(view,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  }
  return local_51;
}

Assistant:

static bool IsCharacterPair(PatternView v, int modsLeft, int modsRight)
{
	float modSizeRef = ModSizeFinder(v);
	return IsCharacter(LeftChar(v), modsLeft, modSizeRef) && IsCharacter(RightChar(v), modsRight, modSizeRef);
}